

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O3

void despot::DESPOT::Expand
               (VNode *vnode,ScenarioLowerBound *lower_bound,ScenarioUpperBound *upper_bound,
               DSPOMDP *model,RandomStreams *streams,History *history)

{
  iterator __position;
  int iVar1;
  int iVar2;
  vector<despot::QNode*,std::allocator<despot::QNode*>> *this;
  log_ostream *plVar3;
  ostream *poVar4;
  long *plVar5;
  QNode *this_00;
  QNode *qnode;
  QNode *local_58;
  ScenarioLowerBound *local_50;
  ScenarioUpperBound *local_48;
  RandomStreams *local_40;
  History *local_38;
  
  local_50 = lower_bound;
  local_48 = upper_bound;
  local_40 = streams;
  local_38 = history;
  this = (vector<despot::QNode*,std::allocator<despot::QNode*>> *)VNode::children(vnode);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (3 < iVar1) {
      plVar3 = logging::stream(4);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar3->super_ostream,"- Expanding vnode ",0x12);
      poVar4 = std::ostream::_M_insert<void_const*>(plVar3);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  iVar1 = (*model->_vptr_DSPOMDP[5])(model);
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      iVar2 = logging::level();
      if (0 < iVar2) {
        iVar2 = logging::level();
        if (3 < iVar2) {
          plVar3 = logging::stream(4);
          std::__ostream_insert<char,std::char_traits<char>>(&plVar3->super_ostream," Action ",8);
          plVar5 = (long *)std::ostream::operator<<(plVar3,iVar1);
          std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
          std::ostream::put((char)plVar5);
          std::ostream::flush();
        }
      }
      this_00 = (QNode *)operator_new(0x88);
      QNode::QNode(this_00,vnode,iVar1);
      __position._M_current = *(QNode ***)(this + 8);
      local_58 = this_00;
      if (__position._M_current == *(QNode ***)(this + 0x10)) {
        std::vector<despot::QNode*,std::allocator<despot::QNode*>>::
        _M_realloc_insert<despot::QNode*const&>(this,__position,&local_58);
      }
      else {
        *__position._M_current = this_00;
        *(long *)(this + 8) = *(long *)(this + 8) + 8;
      }
      Expand(local_58,local_50,local_48,model,local_40,local_38);
      iVar1 = iVar1 + 1;
      iVar2 = (*model->_vptr_DSPOMDP[5])(model);
    } while (iVar1 < iVar2);
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (3 < iVar1) {
      plVar3 = logging::stream(4);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar3->super_ostream,"* Expansion complete!",0x15);
      std::ios::widen((char)(plVar3->super_ostream)._vptr_basic_ostream[-3] + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void DESPOT::Expand(VNode* vnode,
	ScenarioLowerBound* lower_bound, ScenarioUpperBound* upper_bound,
	const DSPOMDP* model, RandomStreams& streams,
	History& history) {
	vector<QNode*>& children = vnode->children();
	logd << "- Expanding vnode " << vnode << endl;
	for (ACT_TYPE action = 0; action < model->NumActions(); action++) {
		logd << " Action " << action << endl;
		QNode* qnode = new QNode(vnode, action);
		children.push_back(qnode);

		Expand(qnode, lower_bound, upper_bound, model, streams, history);
	}
	logd << "* Expansion complete!" << endl;
}